

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.h
# Opt level: O0

int __thiscall cppcms::widgets::numeric<int>::value(numeric<int> *this)

{
  ulong uVar1;
  string *error;
  long in_RDI;
  allocator *this_00;
  allocator local_29;
  string local_28 [40];
  
  uVar1 = cppcms::widgets::base_widget::set();
  if ((uVar1 & 1) == 0) {
    error = (string *)__cxa_allocate_exception(0x30);
    this_00 = &local_29;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"Value not loaded",this_00);
    cppcms_error::cppcms_error((cppcms_error *)this_00,error);
    __cxa_throw(error,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
  }
  return *(int *)(in_RDI + 0x38);
}

Assistant:

T value()
			{
				if(!set())
					throw cppcms_error("Value not loaded");
				return value_;
			}